

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

int raviX_generate_C(LinearizerState *linearizer,TextBuffer *mb,
                    Ravi_CompilerInterface *ravi_interface)

{
  char *pcVar1;
  C_MemoryAllocator *pCVar2;
  Proc *proc;
  int iVar3;
  uint uVar4;
  C_Scope *globalScope;
  C_Token *tok;
  C_Obj *pCVar5;
  Ravi_CompilerInterface *ravi_interface_00;
  C_Parser *local_220;
  C_Scope *local_218;
  undefined8 local_210;
  Ravi_CompilerInterface *local_208;
  TextBuffer code;
  C_MemoryAllocator allocator;
  C_Parser parser;
  
  ravi_interface_00 = &stub_compilerInterface;
  if (ravi_interface != (Ravi_CompilerInterface *)0x0) {
    ravi_interface_00 = ravi_interface;
  }
  raviX_create_string(linearizer->compiler_state,"_ENV",4);
  raviX_buffer_add_string
            (mb,
             "#ifdef __MIRC__\ntypedef __SIZE_TYPE__ size_t;\ntypedef __PTRDIFF_TYPE__ ptrdiff_t;\ntypedef __INTPTR_TYPE__ intptr_t;\ntypedef __INT64_TYPE__ int64_t;\ntypedef __UINT64_TYPE__ uint64_t;\ntypedef __INT32_TYPE__ int32_t;\ntypedef __UINT32_TYPE__ uint32_t;\ntypedef __INT16_TYPE__ int16_t;\ntypedef __UINT16_TYPE__ uint16_t;\ntypedef __INT8_TYPE__ int8_t;\ntypedef __UINT8_TYPE__ uint8_t;\n#define NULL ((void *)0)\n#define EXPORT\n#else\n#include <stddef.h>\n#include <stdint.h>\n#ifdef _WIN32\n#define EXPORT __declspec(dllexport)\n#else\n#define EXPORT\n#endif\n#endif\ntypedef size_t lu_mem;\ntypedef unsigned char lu_byte;\ntypedef uint16_t LuaType;\ntypedef struct lua_State lua_State;\n#define LUA_TNONE\t\t(-1)\n#define LUA_TNIL\t\t0\n#define LUA_TBOOLEAN\t\t1\n#define LUA_TLIGHTUSERDATA\t2\n#define LUA_TNUMBER\t\t3\n#define LUA_TSTRING\t\t4\n#define LUA_TTABLE\t\t5\n#define LUA_TFUNCTION\t\t6\n#define LUA_TUSERDATA\t\t7\n#define LUA_TTHREAD\t\t8\n#define LUA_OK  0\ntypedef enum {TM_INDEX,TM_NEWINDEX,TM_GC,\n\tTM_MODE,TM_LEN,TM_EQ,TM_ADD,TM_SUB,TM_MUL,\n\tTM_MOD,TM_POW,TM_DIV,TM_IDIV,TM_BAND,TM_BOR,\n\tTM_BXOR,TM_SHL,TM_SHR,TM_UNM,TM_BNOT,TM_LT,\n\tTM_LE,TM_CONCAT,TM_CALL,TM_N\n} TMS;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef uint64_t lua_Unsigned;\ntypedef int (*lua_CFunction) (lua_State *L);\ntypedef union {\n\tlua_Number n;\n\tdouble u;\n\tvoid *s;\n\tlua_Integer i;\n\tlong l;\n} L_Umaxalign;\n#define lua_assert(c)\t\t((void)0)\n#define check_exp(c,e)\t\t(e)\n#define lua_longassert(c)\t((void)0)\n#define luai_apicheck(l,e)\tlua_assert(e)\n#define api_check(l,e,msg)\tluai_apicheck(l,(e) && msg)\n#define UNUSED(x)\t((void)(x))\n#define cast(t, exp)\t((t)(exp))\n#define cast_void(i)\tcast(void, (i))\n#define cast_byte(i)\tcast(lu_byte, (i))\n#define cast_num(i)\tcast(lua_Number, (i))\n#define cast_int(i)\tcast(int, (i))\n#define cast_uchar(i)\tcast(unsigned char, (i))\n#define l_castS2U(i)\t((lua_Unsigned)(i))\n#define l_castU2S(i)\t((lua_Integer)(i))\n#define l_noret\t\tvoid\ntypedef unsigned int Instruction;\n#define luai_numidiv(L,a,b)     ((void)L, l_floor(luai_numdiv(L,a,b)))\n#define luai_numdiv(L,a,b)..." /* TRUNCATED STRING LITERAL */
            );
  pcVar1 = (linearizer->C_declarations).buf;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) goto LAB_0011a4af;
  raviX_buffer_init(&code,0x400);
  raviX_buffer_add_string
            (&code,
             "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
            );
  raviX_buffer_add_string(&code,(linearizer->C_declarations).buf);
  pCVar2 = linearizer->compiler_state->allocator;
  allocator.arena = pCVar2->arena;
  allocator.realloc = pCVar2->realloc;
  allocator.calloc = pCVar2->calloc;
  allocator.free = pCVar2->free;
  allocator.create_arena = pCVar2->create_arena;
  allocator.destroy_arena = pCVar2->destroy_arena;
  allocator.arena = (*allocator.create_arena)(0,0);
  C_parser_init(&parser,&allocator);
  globalScope = C_global_scope(&parser);
  local_210 = 0;
  local_220 = &parser;
  local_218 = globalScope;
  local_208 = ravi_interface_00;
  tok = C_tokenize_buffer(&parser,code.buf);
  if (tok == (C_Token *)0x0) {
LAB_0011a462:
    local_210 = CONCAT44(local_210._4_4_,0xffffffff);
    iVar3 = -1;
  }
  else {
    C_convert_pp_tokens(&parser,tok);
    pCVar5 = C_parse(globalScope,&parser,tok);
    if (pCVar5 == (C_Obj *)0x0) goto LAB_0011a462;
    local_210 = CONCAT44(1,(int)local_210);
    hashmap_foreach(&globalScope->tags,analyze_C_declarations,&local_220);
    local_210 = local_210 & 0xffffffff;
    hashmap_foreach(&globalScope->vars,analyze_C_declarations,&local_220);
    iVar3 = (int)local_210;
    if ((int)local_210 == 0) {
      raviX_buffer_add_string(mb,(linearizer->C_declarations).buf);
      iVar3 = (int)local_210;
    }
  }
  if (parser.error_message != (char *)0x0 && iVar3 < 0) {
    (*ravi_interface_00->error_message)(ravi_interface_00->context,parser.error_message);
  }
  C_parser_destroy(&parser);
  (*allocator.destroy_arena)(allocator.arena);
  raviX_buffer_free(&code);
  if ((int)local_210 != 0) {
    return -1;
  }
LAB_0011a4af:
  preprocess_upvalues(linearizer->main_proc);
  iVar3 = generate_C_code(ravi_interface_00,linearizer->main_proc,mb);
  if (iVar3 != 0) {
    return -1;
  }
  proc = linearizer->main_proc;
  raviX_buffer_add_fstring
            (mb,"EXPORT LClosure *%s(lua_State *L) {\n",ravi_interface_00->main_func_name);
  uVar4 = get_num_upvalues(proc);
  raviX_buffer_add_fstring(mb," LClosure *cl = luaF_newLclosure(L, %u);\n",(ulong)uVar4);
  raviX_buffer_add_string(mb," setclLvalue(L, L->top, cl);\n");
  raviX_buffer_add_string(mb," luaD_inctop(L);\n");
  raviX_buffer_add_string(mb," cl->p = luaF_newproto(L);\n");
  raviX_buffer_add_string(mb," Proto *f = cl->p;\n");
  generate_lua_proc(proc,mb);
  raviX_buffer_add_string(mb," return cl;\n");
  raviX_buffer_add_string(mb,"}\n");
  return 0;
}

Assistant:

int raviX_generate_C(LinearizerState *linearizer, TextBuffer *mb, struct Ravi_CompilerInterface *ravi_interface)
{
	if (ravi_interface == NULL)
		ravi_interface = &stub_compilerInterface;

	// _ENV is the name of the Lua up-value that points to the globals table
	raviX_create_string(linearizer->compiler_state, "_ENV", 4);

	/* Add the common header portion */
	// FIXME we need a way to customise this for 32-bit vs 64-bit
	raviX_buffer_add_string(mb, Lua_header);

	/* emit C__decl statements in ravi code */
	if (emit_C__decl(linearizer, ravi_interface, mb) != 0) {
		return -1;
	}

	/* Preprocess upvalue attributes */
	preprocess_upvalues(linearizer->main_proc);

	/* Recursively generate C code for procs */
	if (generate_C_code(ravi_interface, linearizer->main_proc, mb) != 0) {
		return -1;
	}
	generate_lua_closure(linearizer->main_proc, ravi_interface->main_func_name, mb);
	return 0;
}